

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE::predictInverseSingle(IMLE *this,X *x)

{
  ArrayZZ *this_00;
  ArrayScal *this_01;
  double *pdVar1;
  pointer pMVar2;
  pointer pMVar3;
  pointer pMVar4;
  pointer pMVar5;
  pointer pdVar6;
  pointer pFVar7;
  double *pdVar8;
  iterator iVar9;
  undefined1 *rows;
  undefined1 *cols;
  pointer piVar10;
  double dVar11;
  undefined8 uVar12;
  Mat *pMVar13;
  int iVar14;
  double *pdVar15;
  undefined8 *puVar16;
  Index index;
  ulong uVar17;
  Index index_1;
  long lVar18;
  long lVar19;
  Index size;
  Index dstRows;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  Index index_4;
  long lVar23;
  ActualDstType actualDst;
  Index dstCols;
  Mat *pMVar24;
  pointer pMVar25;
  pointer pMVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  type tmp;
  ZZ invVar;
  ZZ sumInvRj;
  undefined1 local_108 [32];
  Mat *local_e8;
  variable_if_dynamic<long,__1> local_e0;
  variable_if_dynamic<long,__1> vStack_d8;
  Z *local_d0;
  Mat *local_c0;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_b8;
  double local_88;
  undefined8 uStack_80;
  Scal local_78;
  undefined8 uStack_70;
  value_type local_68;
  DenseStorage<double,__1,__1,__1,_0> local_50;
  Mat *local_38;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_50,(DenseStorage<double,__1,__1,__1,_0> *)&this->zeroZZ);
  pMVar24 = &this->sumInvRzj;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)pMVar24,(long)this->d,(long)this->d,1);
  lVar18 = (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols *
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
  if (0 < lVar18) {
    memset((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data,0,lVar18 * 8);
  }
  pMVar2 = (this->invPredictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (this->invPredictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar25 = pMVar2;
  if (pMVar3 != pMVar2) {
    do {
      free((pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      pMVar25 = pMVar25 + 1;
    } while (pMVar25 != pMVar3);
    (this->invPredictions).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
  }
  pMVar4 = (this->invPredictionsVar).
           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (this->invPredictionsVar).
           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar26 = pMVar4;
  if (pMVar5 != pMVar4) {
    do {
      free((pMVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data);
      pMVar26 = pMVar26 + 1;
    } while (pMVar26 != pMVar5);
    (this->invPredictionsVar).
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar4;
  }
  pdVar6 = (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar6) {
    (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar6;
  }
  pdVar15 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  if ((this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != 1) {
    free(pdVar15);
    pdVar15 = (double *)malloc(8);
    if (pdVar15 == (double *)0x0) goto LAB_0014bb41;
    (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = pdVar15;
  }
  (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       1;
  *pdVar15 = 0.0;
  pMVar4 = (this->iInvRj).
           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (this->iInvRj).
           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar26 = pMVar4;
  if (pMVar5 != pMVar4) {
    do {
      free((pMVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data);
      pMVar26 = pMVar26 + 1;
    } while (pMVar26 != pMVar5);
    (this->iInvRj).
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar4;
  }
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(&this->iInvRj,(long)this->M);
  lVar23 = (long)this->d;
  lVar18 = (long)this->M;
  if ((lVar18 != 0 && lVar23 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar18),0) < lVar23)) {
LAB_0014bb41:
    puVar16 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar16 = operator_delete;
    __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_c0 = &this->invRzj;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_c0,lVar18 * lVar23,lVar23,lVar18);
  iVar14 = this->M;
  lVar18 = (long)iVar14;
  if ((this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != lVar18) {
    free((this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    if (iVar14 < 1) {
      pdVar15 = (double *)0x0;
    }
    else {
      pdVar15 = (double *)malloc(lVar18 * 8);
      if (pdVar15 == (double *)0x0) goto LAB_0014bb41;
    }
    (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = pdVar15;
  }
  (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       lVar18;
  local_38 = pMVar24;
  if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (long)this->D) {
    if (0 < this->M) {
      dVar27 = 0.0;
      lVar18 = 0;
      do {
        local_88 = dVar27;
        local_108._24_8_ =
             LinearExpert::queryX
                       (&(this->experts).
                         super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         .
                         super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar18].super_LinearExpert,x);
        pFVar7 = (this->experts).
                 super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 .
                 super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_108._0_8_ = &pFVar7[lVar18].super_LinearExpert.pred_z_invVar;
        local_108._8_8_ = *(Index *)((long)&pFVar7[lVar18].super_LinearExpert.pred_z_invVar + 8);
        local_108._16_8_ = *(Index *)((long)&pFVar7[lVar18].super_LinearExpert.pred_z_invVar + 0x10)
        ;
        local_78 = (Scal)local_108._24_8_;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_b8,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)local_108);
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::push_back(&this->iInvRj,(value_type *)&local_b8);
        free((void *)local_b8.
                     super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                     .
                     super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                     .m_d._0_8_);
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d._0_8_ = (this->iInvRj).
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar18;
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             &(this->experts).
              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              .
              super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar18].super_LinearExpert.pred_z;
        pdVar15 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        uVar21 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                  ((Matrix<double,_1,1,0,_1,1> *)local_108,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_b8);
        uVar17 = uVar21;
        if ((((ulong)(pdVar15 + uVar21 * lVar18) & 7) == 0) &&
           (uVar17 = (ulong)((uint)((ulong)(pdVar15 + uVar21 * lVar18) >> 3) & 1),
           (long)uVar21 <= (long)uVar17)) {
          uVar17 = uVar21;
        }
        if (0 < (long)uVar17) {
          uVar20 = 0;
          do {
            *(undefined8 *)((long)pdVar15 + uVar20 * 8 + uVar21 * (long)local_88) =
                 *(undefined8 *)(local_108._0_8_ + uVar20 * 8);
            uVar20 = uVar20 + 1;
          } while (uVar17 != uVar20);
        }
        lVar23 = uVar21 - uVar17;
        uVar20 = (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
        if (1 < lVar23) {
          do {
            uVar12 = *(undefined8 *)((pointer)(local_108._0_8_ + uVar17 * 8) + 8);
            puVar16 = (undefined8 *)((long)pdVar15 + uVar17 * 8 + uVar21 * (long)local_88);
            *puVar16 = *(undefined8 *)(local_108._0_8_ + uVar17 * 8);
            puVar16[1] = uVar12;
            uVar17 = uVar17 + 2;
          } while ((long)uVar17 < (long)uVar20);
        }
        if ((long)uVar20 < (long)uVar21) {
          do {
            *(undefined8 *)((long)pdVar15 + uVar20 * 8 + uVar21 * (long)local_88) =
                 *(undefined8 *)(local_108._0_8_ + uVar20 * 8);
            uVar20 = uVar20 + 1;
          } while (uVar21 != uVar20);
        }
        free((void *)local_108._0_8_);
        local_108._0_8_ =
             &(this->experts).
              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              .
              super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar18].super_LinearExpert.pred_z;
        local_108._16_8_ =
             (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        local_108._8_8_ =
             (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data + local_108._16_8_ * lVar18;
        local_e8 = local_c0;
        local_e0.m_value = 0;
        vStack_d8.m_value = lVar18;
        local_d0 = (Z *)local_108._16_8_;
        if ((Z *)local_108._16_8_ == (Z *)0x0) {
          dVar27 = 0.0;
        }
        else {
          local_b8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (((Z *)local_108._0_8_)->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
          local_b8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.rhsImpl.
          super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
          super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_data = (PointerType)local_108._8_8_;
          local_b8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.rhsImpl.
          super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
          super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_outerStride.m_value = local_108._16_8_;
          dVar27 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                             (&local_b8,(scalar_sum_op<double,_double> *)&local_68,
                              (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                               *)local_108);
        }
        (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[lVar18] = dVar27;
        pdVar15 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        *pdVar15 = local_78 + *pdVar15;
        lVar23 = (long)(this->iInvRj).
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar18].
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data;
        lVar19 = local_50.m_cols * local_50.m_rows;
        uVar21 = lVar19 - (lVar19 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < lVar19) {
          lVar22 = 0;
          do {
            pdVar15 = (double *)(lVar23 + lVar22 * 8);
            dVar11 = pdVar15[1];
            dVar27 = (local_50.m_data + lVar22)[1];
            local_50.m_data[lVar22] = *pdVar15 + local_50.m_data[lVar22];
            (local_50.m_data + lVar22)[1] = dVar11 + dVar27;
            lVar22 = lVar22 + 2;
          } while (lVar22 < (long)uVar21);
        }
        if ((long)uVar21 < lVar19) {
          do {
            local_50.m_data[uVar21] = *(double *)(lVar23 + uVar21 * 8) + local_50.m_data[uVar21];
            uVar21 = uVar21 + 1;
          } while (lVar19 - uVar21 != 0);
        }
        pdVar15 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        lVar23 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        pdVar8 = (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        uVar21 = (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        uVar17 = uVar21;
        if ((((ulong)pdVar8 & 7) == 0) &&
           (uVar17 = (ulong)((uint)((ulong)pdVar8 >> 3) & 1), (long)uVar21 <= (long)uVar17)) {
          uVar17 = uVar21;
        }
        if (0 < (long)uVar17) {
          uVar20 = 0;
          do {
            pdVar8[uVar20] =
                 *(double *)((long)pdVar15 + uVar20 * 8 + lVar23 * (long)local_88) + pdVar8[uVar20];
            uVar20 = uVar20 + 1;
          } while (uVar17 != uVar20);
        }
        lVar19 = uVar21 - uVar17;
        uVar20 = (lVar19 - (lVar19 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
        if (1 < lVar19) {
          do {
            pdVar1 = (double *)((long)pdVar15 + uVar17 * 8 + lVar23 * (long)local_88);
            dVar11 = pdVar1[1];
            dVar27 = (pdVar8 + uVar17)[1];
            pdVar8[uVar17] = *pdVar1 + pdVar8[uVar17];
            (pdVar8 + uVar17)[1] = dVar11 + dVar27;
            uVar17 = uVar17 + 2;
          } while ((long)uVar17 < (long)uVar20);
        }
        if ((long)uVar20 < (long)uVar21) {
          do {
            pdVar8[uVar20] =
                 *(double *)((long)pdVar15 + uVar20 * 8 + lVar23 * (long)local_88) + pdVar8[uVar20];
            uVar20 = uVar20 + 1;
          } while (uVar21 != uVar20);
        }
        lVar18 = lVar18 + 1;
        dVar27 = (double)((long)local_88 + 8);
      } while (lVar18 < this->M);
    }
  }
  else {
    local_108._0_8_ = (Z *)(local_108 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,
               "IMLE::predict: query dimension does not match output dimension!!","");
    message(this,(string *)local_108);
    if ((Z *)local_108._0_8_ != (Z *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
    }
    pdVar15 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    if ((this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != 1) {
      free(pdVar15);
      pdVar15 = (double *)malloc(8);
      if (pdVar15 == (double *)0x0) goto LAB_0014bb41;
      (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar15;
    }
    (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = 1;
    *pdVar15 = 0.0;
  }
  pMVar24 = (Mat *)&this->invPredictions;
  this_00 = &this->invPredictionsVar;
  this_01 = &this->invPredictionsWeight;
  pdVar15 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  this->sumAll = *pdVar15 + this->pNoiseModelX;
  dVar27 = *pdVar15;
  if ((dVar27 != 0.0) || (NAN(dVar27))) {
    dVar27 = (this->param).multiValuedSignificance;
    if ((dVar27 != 0.0) || (NAN(dVar27))) {
      local_108._0_8_ = &local_50;
      local_b8.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d._0_8_ = (pointer)0x0;
      local_b8.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)0x0;
      local_b8.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.
      super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = (PointerType)0x0;
      if ((local_50.m_rows != 0 && local_50.m_cols != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_50.m_rows),0) <
          local_50.m_cols)) {
        puVar16 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar16 = operator_delete;
        __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_b8,local_50.m_rows * local_50.m_cols,
                 local_50.m_cols,local_50.m_rows);
      pMVar13 = local_38;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_b8,(SrcXprType *)local_108,
            (assign_op<double,_double> *)&local_68);
      local_108._8_8_ =
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
      local_108._16_8_ =
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
      local_e8 = pMVar13;
      local_e0.m_value = 0;
      vStack_d8.m_value = 0;
      local_108._0_8_ = &local_b8;
      local_d0 = (Z *)local_108._16_8_;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_68,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>_>
                  *)local_108);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)pMVar24,(value_type *)&local_68);
      free(local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      local_108._24_8_ = this->sumAll;
      local_108._8_8_ =
           local_b8.
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
           .
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
           data;
      local_108._16_8_ =
           local_b8.
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
           .
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.rhsImpl.
           super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data;
      local_108._0_8_ = &local_b8;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_68,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)local_108);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back(this_00,&local_68);
      free(local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      local_108._0_8_ =
           *(this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data / this->sumAll;
      iVar9._M_current =
           (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                  (this_01,iVar9,(value_type *)local_108);
      }
      else {
        *iVar9._M_current = (double)local_108._0_8_;
        (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      free((void *)local_b8.
                   super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                   .
                   super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                   .m_d._0_8_);
      this->nInvSolFound = 1;
      piVar10 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar10) {
        (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar10;
      }
      std::vector<int,_std::allocator<int>_>::resize(&this->sNearestInv,(long)this->M,0);
      goto LAB_0014b92f;
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::reserve((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)pMVar24,(long)this->M);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::reserve(this_00,(long)this->M);
    std::vector<double,_std::allocator<double>_>::reserve(this_01,(long)this->M);
    iVar14 = this->M;
    if (0 < iVar14) {
      lVar18 = 0;
      local_c0 = pMVar24;
      do {
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)pMVar24,
                    &(this->experts).
                     super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     .
                     super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar18].super_LinearExpert.pred_z);
        pFVar7 = (this->experts).
                 super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 .
                 super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_88 = pFVar7[lVar18].super_LinearExpert.p_x_Norm;
        uStack_80 = 0;
        local_78 = this->pNoiseModelX + local_88;
        uStack_70 = 0;
        rows = *(undefined1 **)((long)&pFVar7[lVar18].super_LinearExpert.pred_z_var + 8);
        cols = *(undefined1 **)((long)&pFVar7[lVar18].super_LinearExpert.pred_z_var + 0x10);
        local_108._0_8_ = (LhsNested)0x0;
        local_108._8_8_ = (Z *)0x0;
        local_108._16_8_ = (Z *)0x0;
        if ((cols != (undefined1 *)0x0 && rows != (undefined1 *)0x0) &&
           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)cols),0) <
            (long)rows)) {
LAB_0014bb13:
          puVar16 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar16 = operator_delete;
          __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        uVar21 = (long)cols * (long)rows;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)local_108,uVar21,(Index)rows,(Index)cols);
        lVar23 = *(long *)&pFVar7[lVar18].super_LinearExpert.pred_z_var.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage;
        if (((undefined1 *)local_108._8_8_ != rows) || ((undefined1 *)local_108._16_8_ != cols)) {
          if ((cols != (undefined1 *)0x0 && rows != (undefined1 *)0x0) &&
             (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)cols),0) <
              (long)rows)) goto LAB_0014bb13;
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                    ((DenseStorage<double,__1,__1,__1,_0> *)local_108,uVar21,(Index)rows,(Index)cols
                    );
          uVar21 = local_108._8_8_ * local_108._16_8_;
        }
        pMVar24 = local_c0;
        uVar17 = uVar21 - ((long)uVar21 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar21) {
          lVar19 = 0;
          do {
            pdVar15 = (double *)(lVar23 + lVar19 * 8);
            auVar28._0_8_ = *pdVar15 * local_78;
            auVar28._8_8_ = pdVar15[1] * local_78;
            auVar29._8_8_ = local_88;
            auVar29._0_8_ = local_88;
            auVar29 = divpd(auVar28,auVar29);
            *(undefined1 (*) [16])(local_108._0_8_ + lVar19 * 8) = auVar29;
            lVar19 = lVar19 + 2;
          } while (lVar19 < (long)uVar17);
        }
        if ((long)uVar17 < (long)uVar21) {
          do {
            *(double *)(local_108._0_8_ + uVar17 * 8) =
                 (*(double *)(lVar23 + uVar17 * 8) * local_78) / local_88;
            uVar17 = uVar17 + 1;
          } while (uVar21 != uVar17);
        }
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::push_back(this_00,(value_type *)local_108);
        free((void *)local_108._0_8_);
        local_108._0_8_ =
             (this->experts).
             super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             .
             super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar18].super_LinearExpert.p_x_Norm /
             this->sumAll;
        iVar9._M_current =
             (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                    (this_01,iVar9,(value_type *)local_108);
        }
        else {
          *iVar9._M_current = (double)local_108._0_8_;
          (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
        lVar18 = lVar18 + 1;
        iVar14 = this->M;
      } while (lVar18 < iVar14);
    }
  }
  else {
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)pMVar24,&this->zeroZ);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::push_back(this_00,&this->infinityZZ);
    local_108._0_8_ = (Z *)0x0;
    iVar9._M_current =
         (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                (this_01,iVar9,(value_type *)local_108);
    }
    else {
      *iVar9._M_current = 0.0;
      (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar9._M_current + 1;
    }
    iVar14 = 1;
  }
  this->nInvSolFound = iVar14;
LAB_0014b92f:
  free(local_50.m_data);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::predictInverseSingle(X const &x)
{
    // Aux variables
    ZZ sumInvRj = zeroZZ;
    sumInvRzj.setZero(d,1);

    // Clear predict data structure
    invPredictions.clear();
    invPredictionsVar.clear();
    invPredictionsWeight.clear();

    sum_p_x.resize(1);
    sum_p_x(0) = 0.0;
    iInvRj.clear(); iInvRj.reserve(M);
    invRzj.resize(d,M);
    zInvRzj.resize(M);

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( x.size() != D )
    {
        message("IMLE::predict: query dimension does not match output dimension!!");

        sum_p_x.setZero(1);
    }
    else
#endif
        for(int j = 0; j < M; j++)
        {
            Scal p_x = experts[j].queryX(x);

            // These are needed for multivalued inverse prediction
            iInvRj.push_back(experts[j].getPredZInvVar() * p_x );
            invRzj.col(j) = iInvRj[j] * experts[j].getPredZ();
            zInvRzj(j) = experts[j].getPredZ().dot( invRzj.col(j) );

            sum_p_x(0) += p_x;
            sumInvRj += iInvRj[j];
            sumInvRzj.col(0) += invRzj.col(j);
        }
    sumAll = sum_p_x(0) + pNoiseModelX;

    if(sum_p_x(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        invPredictions.push_back(zeroZ);
        invPredictionsVar.push_back( infinityZZ );
        invPredictionsWeight.push_back(0.0);

        nInvSolFound = 1;
        return;
    }
    else if( param.multiValuedSignificance == 0.0 )
    {
        invPredictions.reserve(M);
        invPredictionsVar.reserve(M);
        invPredictionsWeight.reserve(M);

        for(int j = 0; j < M; j++)
        {
            invPredictions.push_back( experts[j].getPredZ() );
            invPredictionsVar.push_back( experts[j].getPredZVar() *(experts[j].get_p_x() + pNoiseModelX) / experts[j].get_p_x() );
            invPredictionsWeight.push_back(experts[j].get_p_x() / sumAll);
        }

        nInvSolFound = M;
        return;
    }
    else
    {
        ZZ invVar = sumInvRj.inverse();

        invPredictions.push_back( invVar * sumInvRzj.col(0) );
        invPredictionsVar.push_back( invVar * sumAll );
        invPredictionsWeight.push_back(sum_p_x(0) / sumAll );
    }

    nInvSolFound = 1;
    sNearestInv.clear();
    sNearestInv.resize(M,0);
}